

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall flatbuffers::cpp::CppGenerator::GenUnionPost(CppGenerator *this,EnumDef *enum_def)

{
  StructDef *def;
  char *__s;
  EnumDef *pEVar1;
  bool bVar2;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_00;
  EnumVal *pEVar4;
  reference ppEVar5;
  allocator<char> local_12f1;
  string local_12f0;
  allocator<char> local_12c9;
  string local_12c8;
  allocator<char> local_12a1;
  string local_12a0;
  allocator<char> local_1279;
  string local_1278;
  allocator<char> local_1251;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  allocator<char> local_11b1;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  allocator<char> local_1161;
  string local_1160;
  string local_1140;
  allocator<char> local_1119;
  string local_1118;
  string local_10f8;
  allocator<char> local_10d1;
  string local_10d0;
  EnumVal *local_10b0;
  EnumVal *ev_4;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_10a0;
  const_iterator it_3;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040;
  string local_1020;
  allocator<char> local_ff9;
  string local_ff8;
  allocator<char> local_fd1;
  string local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  allocator<char> local_f81;
  string local_f80;
  allocator<char> local_f59;
  string local_f58;
  allocator<char> local_f31;
  string local_f30;
  allocator<char> local_f09;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  reference local_e48;
  FieldDef **field;
  iterator __end5;
  iterator __begin5;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range5;
  undefined1 local_e20 [6];
  bool copyable;
  string local_e00;
  allocator<char> local_dd9;
  string local_dd8;
  string local_db8;
  allocator<char> local_d91;
  string local_d90;
  reference local_d70;
  EnumVal **ev_3;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *__range3;
  string local_d48;
  allocator<char> local_d21;
  string local_d20;
  allocator<char> local_cf9;
  string local_cf8;
  allocator<char> local_cd1;
  string local_cd0;
  allocator<char> local_ca9;
  string local_ca8;
  allocator<char> local_c81;
  string local_c80;
  allocator<char> local_c59;
  string local_c58;
  allocator<char> local_c31;
  string local_c30;
  allocator<char> local_c09;
  string local_c08;
  allocator<char> local_be1;
  string local_be0;
  allocator<char> local_bb9;
  string local_bb8;
  allocator<char> local_b91;
  string local_b90;
  allocator<char> local_b69;
  string local_b68;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  string local_b00;
  allocator<char> local_ad9;
  string local_ad8;
  EnumVal *local_ab8;
  EnumVal *ev_2;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_aa8;
  const_iterator it_2;
  string local_a98;
  allocator<char> local_a71;
  string local_a70;
  string local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  allocator<char> local_999;
  string local_998;
  allocator<char> local_971;
  string local_970;
  allocator<char> local_949;
  string local_948;
  allocator<char> local_921;
  string local_920;
  allocator<char> local_8f9;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  string local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  EnumVal *local_770;
  EnumVal *ev_1;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_760;
  const_iterator it_1;
  string local_750;
  allocator<char> local_729;
  string local_728;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  string local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  string local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  char *local_1d0;
  char *getptr;
  string local_1c0;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  string local_158;
  allocator<char> local_131;
  string local_130;
  EnumVal *local_110;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_100;
  const_iterator it;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  EnumDef *local_18;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  local_18 = enum_def;
  enum_def_local = (EnumDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ENUM_NAME",&local_39);
  Name_abi_cxx11_(&local_70,this,&local_18->super_Definition);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  UnionVerifySignature_abi_cxx11_(&local_d0,this,local_18);
  std::operator+(&local_b0,"inline ",&local_d0);
  std::operator+(&local_90,&local_b0," {");
  CodeWriter::operator+=(&this->code_,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"  switch (type) {",(allocator<char> *)((long)&it._M_current + 7));
  CodeWriter::operator+=(&this->code_,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  pvVar3 = EnumDef::Vals(local_18);
  local_100._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3);
  while( true ) {
    pvVar3 = EnumDef::Vals(local_18);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar3);
    bVar2 = __gnu_cxx::operator!=
                      (&local_100,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev);
    if (!bVar2) break;
    ppEVar5 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_100);
    local_110 = *ppEVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"LABEL",&local_131);
    GetEnumValUse_abi_cxx11_(&local_158,this,local_18,local_110);
    CodeWriter::SetValue(&this->code_,&local_130,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    bVar2 = EnumVal::IsNonZero(local_110);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"TYPE",&local_179);
      GetUnionElement_abi_cxx11_(&local_1a0,this,local_110,false,&(this->opts_).super_IDLOptions);
      CodeWriter::SetValue(&this->code_,&local_178,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"    case {{LABEL}}: {",(allocator<char> *)((long)&getptr + 7)
                );
      CodeWriter::operator+=(&this->code_,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&getptr + 7));
      local_1d0 = "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);";
      if ((local_110->union_type).base_type == BASE_TYPE_STRUCT) {
        if ((((local_110->union_type).struct_def)->fixed & 1U) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_260,
                     "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);",&local_261);
          CodeWriter::operator+=(&this->code_,&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator(&local_261);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"      return verifier.VerifyTable(ptr);",&local_289);
          CodeWriter::operator+=(&this->code_,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator(&local_289);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f0,"ALIGN",&local_1f1);
          NumToString<unsigned_long>(&local_218,((local_110->union_type).struct_def)->minalign);
          CodeWriter::SetValue(&this->code_,&local_1f0,&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator(&local_1f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,
                     "      return verifier.VerifyField<{{TYPE}}>(static_cast<const uint8_t *>(obj), 0, {{ALIGN}});"
                     ,&local_239);
          CodeWriter::operator+=(&this->code_,&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          std::allocator<char>::~allocator(&local_239);
        }
      }
      else {
        bVar2 = IsString(&local_110->union_type);
        __s = local_1d0;
        if (!bVar2) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                        ,0x652,"void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)")
          ;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,__s,&local_2b1);
        CodeWriter::operator+=(&this->code_,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"      return verifier.VerifyString(ptr);",&local_2d9);
        CodeWriter::operator+=(&this->code_,&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::allocator<char>::~allocator(&local_2d9);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"    }",&local_301);
      CodeWriter::operator+=(&this->code_,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"    case {{LABEL}}: {",&local_329);
      CodeWriter::operator+=(&this->code_,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"      return true;",&local_351);
      CodeWriter::operator+=(&this->code_,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"    }",&local_379);
      CodeWriter::operator+=(&this->code_,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_100);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"    default: return true;",&local_3a1);
  CodeWriter::operator+=(&this->code_,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"  }",&local_3c9);
  CodeWriter::operator+=(&this->code_,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"}",&local_3f1);
  CodeWriter::operator+=(&this->code_,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"",&local_419);
  CodeWriter::operator+=(&this->code_,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  UnionVectorVerifySignature_abi_cxx11_(&local_480,this,local_18);
  std::operator+(&local_460,"inline ",&local_480);
  std::operator+(&local_440,&local_460," {");
  CodeWriter::operator+=(&this->code_,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"  if (!values || !types) return !values && !types;",&local_4a1);
  CodeWriter::operator+=(&this->code_,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"  if (values->size() != types->size()) return false;",&local_4c9)
  ;
  CodeWriter::operator+=(&this->code_,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,
             "  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {",&local_4f1);
  CodeWriter::operator+=(&this->code_,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  Name_abi_cxx11_(&local_558,this,&local_18->super_Definition);
  std::operator+(&local_538,"    if (!Verify",&local_558);
  std::operator+(&local_518,&local_538,"(");
  CodeWriter::operator+=(&this->code_,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_558);
  Name_abi_cxx11_(&local_5b8,this,&local_18->super_Definition);
  std::operator+(&local_598,"        verifier,  values->Get(i), types->GetEnum<",&local_5b8);
  std::operator+(&local_578,&local_598,">(i))) {");
  CodeWriter::operator+=(&this->code_,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"      return false;",&local_5d9);
  CodeWriter::operator+=(&this->code_,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"    }",&local_601);
  CodeWriter::operator+=(&this->code_,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"  }",&local_629);
  CodeWriter::operator+=(&this->code_,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"  return true;",&local_651);
  CodeWriter::operator+=(&this->code_,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator(&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"}",&local_679);
  CodeWriter::operator+=(&this->code_,&local_678);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator(&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"",&local_6a1);
  CodeWriter::operator+=(&this->code_,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
    UnionUnPackSignature_abi_cxx11_(&local_708,this,local_18,false);
    std::operator+(&local_6e8,"inline ",&local_708);
    std::operator+(&local_6c8,&local_6e8," {");
    CodeWriter::operator+=(&this->code_,&local_6c8);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_728,"  (void)resolver;",&local_729);
    CodeWriter::operator+=(&this->code_,&local_728);
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator(&local_729);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_750,"  switch (type) {",
               (allocator<char> *)((long)&it_1._M_current + 7));
    CodeWriter::operator+=(&this->code_,&local_750);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_current + 7));
    pvVar3 = EnumDef::Vals(local_18);
    local_760._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3)
    ;
    while( true ) {
      pvVar3 = EnumDef::Vals(local_18);
      ev_1 = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar3);
      bVar2 = __gnu_cxx::operator!=
                        (&local_760,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev_1);
      if (!bVar2) break;
      ppEVar5 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_760);
      local_770 = *ppEVar5;
      bVar2 = EnumVal::IsZero(local_770);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"LABEL",&local_791);
        GetEnumValUse_abi_cxx11_(&local_7b8,this,local_18,local_770);
        CodeWriter::SetValue(&this->code_,&local_790,&local_7b8);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::__cxx11::string::~string((string *)&local_790);
        std::allocator<char>::~allocator(&local_791);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"TYPE",&local_7d9);
        GetUnionElement_abi_cxx11_(&local_800,this,local_770,false,&(this->opts_).super_IDLOptions);
        CodeWriter::SetValue(&this->code_,&local_7d8,&local_800);
        std::__cxx11::string::~string((string *)&local_800);
        std::__cxx11::string::~string((string *)&local_7d8);
        std::allocator<char>::~allocator(&local_7d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_820,"    case {{LABEL}}: {",&local_821);
        CodeWriter::operator+=(&this->code_,&local_820);
        std::__cxx11::string::~string((string *)&local_820);
        std::allocator<char>::~allocator(&local_821);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_848,"      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);",
                   &local_849);
        CodeWriter::operator+=(&this->code_,&local_848);
        std::__cxx11::string::~string((string *)&local_848);
        std::allocator<char>::~allocator(&local_849);
        if ((local_770->union_type).base_type == BASE_TYPE_STRUCT) {
          if ((((local_770->union_type).struct_def)->fixed & 1U) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8f8,"      return ptr->UnPack(resolver);",&local_8f9);
            CodeWriter::operator+=(&this->code_,&local_8f8);
            std::__cxx11::string::~string((string *)&local_8f8);
            std::allocator<char>::~allocator(&local_8f9);
          }
          else {
            def = (local_770->union_type).struct_def;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"",&local_8d1);
            BaseGenerator::WrapInNameSpace
                      (&local_8b0,&this->super_BaseGenerator,&def->super_Definition,&local_8d0);
            std::operator+(&local_890,"      return new ",&local_8b0);
            std::operator+(&local_870,&local_890,"(*ptr);");
            CodeWriter::operator+=(&this->code_,&local_870);
            std::__cxx11::string::~string((string *)&local_870);
            std::__cxx11::string::~string((string *)&local_890);
            std::__cxx11::string::~string((string *)&local_8b0);
            std::__cxx11::string::~string((string *)&local_8d0);
            std::allocator<char>::~allocator(&local_8d1);
          }
        }
        else {
          bVar2 = IsString(&local_770->union_type);
          if (!bVar2) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                          ,0x687,
                          "void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_920,"      return new std::string(ptr->c_str(), ptr->size());"
                     ,&local_921);
          CodeWriter::operator+=(&this->code_,&local_920);
          std::__cxx11::string::~string((string *)&local_920);
          std::allocator<char>::~allocator(&local_921);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"    }",&local_949);
        CodeWriter::operator+=(&this->code_,&local_948);
        std::__cxx11::string::~string((string *)&local_948);
        std::allocator<char>::~allocator(&local_949);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_760);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_970,"    default: return nullptr;",&local_971);
    CodeWriter::operator+=(&this->code_,&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::allocator<char>::~allocator(&local_971);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"  }",&local_999);
    CodeWriter::operator+=(&this->code_,&local_998);
    std::__cxx11::string::~string((string *)&local_998);
    std::allocator<char>::~allocator(&local_999);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c0,"}",&local_9c1);
    CodeWriter::operator+=(&this->code_,&local_9c0);
    std::__cxx11::string::~string((string *)&local_9c0);
    std::allocator<char>::~allocator(&local_9c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"",&local_9e9);
    CodeWriter::operator+=(&this->code_,&local_9e8);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::allocator<char>::~allocator(&local_9e9);
    UnionPackSignature_abi_cxx11_(&local_a50,this,local_18,false);
    std::operator+(&local_a30,"inline ",&local_a50);
    std::operator+(&local_a10,&local_a30," {");
    CodeWriter::operator+=(&this->code_,&local_a10);
    std::__cxx11::string::~string((string *)&local_a10);
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::string::~string((string *)&local_a50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a70,"  (void)_rehasher;",&local_a71);
    CodeWriter::operator+=(&this->code_,&local_a70);
    std::__cxx11::string::~string((string *)&local_a70);
    std::allocator<char>::~allocator(&local_a71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a98,"  switch (type) {",
               (allocator<char> *)((long)&it_2._M_current + 7));
    CodeWriter::operator+=(&this->code_,&local_a98);
    std::__cxx11::string::~string((string *)&local_a98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it_2._M_current + 7));
    pvVar3 = EnumDef::Vals(local_18);
    local_aa8._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3)
    ;
    while( true ) {
      pvVar3 = EnumDef::Vals(local_18);
      ev_2 = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar3);
      bVar2 = __gnu_cxx::operator!=
                        (&local_aa8,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev_2);
      if (!bVar2) break;
      ppEVar5 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_aa8);
      local_ab8 = *ppEVar5;
      bVar2 = EnumVal::IsZero(local_ab8);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"LABEL",&local_ad9);
        GetEnumValUse_abi_cxx11_(&local_b00,this,local_18,local_ab8);
        CodeWriter::SetValue(&this->code_,&local_ad8,&local_b00);
        std::__cxx11::string::~string((string *)&local_b00);
        std::__cxx11::string::~string((string *)&local_ad8);
        std::allocator<char>::~allocator(&local_ad9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b20,"TYPE",&local_b21);
        GetUnionElement_abi_cxx11_(&local_b48,this,local_ab8,true,&(this->opts_).super_IDLOptions);
        CodeWriter::SetValue(&this->code_,&local_b20,&local_b48);
        std::__cxx11::string::~string((string *)&local_b48);
        std::__cxx11::string::~string((string *)&local_b20);
        std::allocator<char>::~allocator(&local_b21);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b68,"    case {{LABEL}}: {",&local_b69);
        CodeWriter::operator+=(&this->code_,&local_b68);
        std::__cxx11::string::~string((string *)&local_b68);
        std::allocator<char>::~allocator(&local_b69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b90,
                   "      auto ptr = reinterpret_cast<const {{TYPE}} *>(value);",&local_b91);
        CodeWriter::operator+=(&this->code_,&local_b90);
        std::__cxx11::string::~string((string *)&local_b90);
        std::allocator<char>::~allocator(&local_b91);
        if ((local_ab8->union_type).base_type == BASE_TYPE_STRUCT) {
          if ((((local_ab8->union_type).struct_def)->fixed & 1U) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_be0,"NAME",&local_be1);
            CodeWriter::SetValue
                      (&this->code_,&local_be0,(string *)(local_ab8->union_type).struct_def);
            std::__cxx11::string::~string((string *)&local_be0);
            std::allocator<char>::~allocator(&local_be1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c08,
                       "      return Create{{NAME}}(_fbb, ptr, _rehasher).Union();",&local_c09);
            CodeWriter::operator+=(&this->code_,&local_c08);
            std::__cxx11::string::~string((string *)&local_c08);
            std::allocator<char>::~allocator(&local_c09);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_bb8,"      return _fbb.CreateStruct(*ptr).Union();",
                       &local_bb9);
            CodeWriter::operator+=(&this->code_,&local_bb8);
            std::__cxx11::string::~string((string *)&local_bb8);
            std::allocator<char>::~allocator(&local_bb9);
          }
        }
        else {
          bVar2 = IsString(&local_ab8->union_type);
          if (!bVar2) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                          ,0x6a7,
                          "void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c30,"      return _fbb.CreateString(*ptr).Union();",&local_c31
                    );
          CodeWriter::operator+=(&this->code_,&local_c30);
          std::__cxx11::string::~string((string *)&local_c30);
          std::allocator<char>::~allocator(&local_c31);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c58,"    }",&local_c59);
        CodeWriter::operator+=(&this->code_,&local_c58);
        std::__cxx11::string::~string((string *)&local_c58);
        std::allocator<char>::~allocator(&local_c59);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_aa8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c80,"    default: return 0;",&local_c81);
    CodeWriter::operator+=(&this->code_,&local_c80);
    std::__cxx11::string::~string((string *)&local_c80);
    std::allocator<char>::~allocator(&local_c81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca8,"  }",&local_ca9);
    CodeWriter::operator+=(&this->code_,&local_ca8);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::allocator<char>::~allocator(&local_ca9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_cd0,"}",&local_cd1);
    CodeWriter::operator+=(&this->code_,&local_cd0);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::allocator<char>::~allocator(&local_cd1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_cf8,"",&local_cf9);
    CodeWriter::operator+=(&this->code_,&local_cf8);
    std::__cxx11::string::~string((string *)&local_cf8);
    std::allocator<char>::~allocator(&local_cf9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d20,
               "inline {{ENUM_NAME}}Union::{{ENUM_NAME}}Union(const {{ENUM_NAME}}Union &u) : type(u.type), value(nullptr) {"
               ,&local_d21);
    CodeWriter::operator+=(&this->code_,&local_d20);
    std::__cxx11::string::~string((string *)&local_d20);
    std::allocator<char>::~allocator(&local_d21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d48,"  switch (type) {",(allocator<char> *)((long)&__range3 + 7));
    CodeWriter::operator+=(&this->code_,&local_d48);
    std::__cxx11::string::~string((string *)&local_d48);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    pvVar3 = EnumDef::Vals(local_18);
    __end3 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                       (pvVar3);
    ev_3 = (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar3)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                                       *)&ev_3), bVar2) {
      local_d70 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&__end3);
      bVar2 = EnumVal::IsZero(*local_d70);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d90,"LABEL",&local_d91);
        GetEnumValUse_abi_cxx11_(&local_db8,this,local_18,*local_d70);
        CodeWriter::SetValue(&this->code_,&local_d90,&local_db8);
        std::__cxx11::string::~string((string *)&local_db8);
        std::__cxx11::string::~string((string *)&local_d90);
        std::allocator<char>::~allocator(&local_d91);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd8,"TYPE",&local_dd9);
        GetUnionElement_abi_cxx11_(&local_e00,this,*local_d70,true,&(this->opts_).super_IDLOptions);
        CodeWriter::SetValue(&this->code_,&local_dd8,&local_e00);
        std::__cxx11::string::~string((string *)&local_e00);
        std::__cxx11::string::~string((string *)&local_dd8);
        std::allocator<char>::~allocator(&local_dd9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_e20,"    case {{LABEL}}: {",
                   (allocator<char> *)((long)&__range5 + 7));
        CodeWriter::operator+=(&this->code_,(string *)local_e20);
        std::__cxx11::string::~string((string *)local_e20);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range5 + 7));
        __range5._6_1_ = 1;
        if (((*(int *)&(this->opts_).super_IDLOptions.field_0x30c < 1) &&
            (((*local_d70)->union_type).base_type == BASE_TYPE_STRUCT)) &&
           (((((*local_d70)->union_type).struct_def)->fixed & 1U) == 0)) {
          this_00 = &((((*local_d70)->union_type).struct_def)->fields).vec;
          __end5 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                   begin(this_00);
          field = (FieldDef **)
                  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                  end(this_00);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                             *)&field), bVar2) {
            local_e48 = __gnu_cxx::
                        __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        ::operator*(&__end5);
            if (((((*local_e48)->deprecated & 1U) == 0) &&
                (((*local_e48)->value).type.struct_def != (StructDef *)0x0)) &&
               (((*local_e48)->native_inline & 1U) == 0)) {
              __range5._6_1_ = 0;
              break;
            }
            __gnu_cxx::
            __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
            ::operator++(&__end5);
          }
        }
        if ((__range5._6_1_ & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e90,
                     "      FLATBUFFERS_ASSERT(false);  // {{TYPE}} not copyable.",&local_e91);
          CodeWriter::operator+=(&this->code_,&local_e90);
          std::__cxx11::string::~string((string *)&local_e90);
          std::allocator<char>::~allocator(&local_e91);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e68,
                     "      value = new {{TYPE}}(*reinterpret_cast<{{TYPE}} *>(u.value));",
                     &local_e69);
          CodeWriter::operator+=(&this->code_,&local_e68);
          std::__cxx11::string::~string((string *)&local_e68);
          std::allocator<char>::~allocator(&local_e69);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_eb8,"      break;",&local_eb9);
        CodeWriter::operator+=(&this->code_,&local_eb8);
        std::__cxx11::string::~string((string *)&local_eb8);
        std::allocator<char>::~allocator(&local_eb9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ee0,"    }",&local_ee1);
        CodeWriter::operator+=(&this->code_,&local_ee0);
        std::__cxx11::string::~string((string *)&local_ee0);
        std::allocator<char>::~allocator(&local_ee1);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&__end3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f08,"    default:",&local_f09);
    CodeWriter::operator+=(&this->code_,&local_f08);
    std::__cxx11::string::~string((string *)&local_f08);
    std::allocator<char>::~allocator(&local_f09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f30,"      break;",&local_f31);
    CodeWriter::operator+=(&this->code_,&local_f30);
    std::__cxx11::string::~string((string *)&local_f30);
    std::allocator<char>::~allocator(&local_f31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f58,"  }",&local_f59);
    CodeWriter::operator+=(&this->code_,&local_f58);
    std::__cxx11::string::~string((string *)&local_f58);
    std::allocator<char>::~allocator(&local_f59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f80,"}",&local_f81);
    CodeWriter::operator+=(&this->code_,&local_f80);
    std::__cxx11::string::~string((string *)&local_f80);
    std::allocator<char>::~allocator(&local_f81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_fa8,"",&local_fa9);
    CodeWriter::operator+=(&this->code_,&local_fa8);
    std::__cxx11::string::~string((string *)&local_fa8);
    std::allocator<char>::~allocator(&local_fa9);
    pEVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_fd0,"NONE",&local_fd1);
    pEVar4 = EnumDef::Lookup(pEVar1,&local_fd0);
    if (pEVar4 == (EnumVal *)0x0) {
      __assert_fail("enum_def.Lookup(\"NONE\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x6da,"void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
    }
    std::__cxx11::string::~string((string *)&local_fd0);
    std::allocator<char>::~allocator(&local_fd1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ff8,"NONE",&local_ff9);
    pEVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1040,"NONE",&local_1041);
    pEVar4 = EnumDef::Lookup(pEVar1,&local_1040);
    GetEnumValUse_abi_cxx11_(&local_1020,this,pEVar1,pEVar4);
    CodeWriter::SetValue(&this->code_,&local_ff8,&local_1020);
    std::__cxx11::string::~string((string *)&local_1020);
    std::__cxx11::string::~string((string *)&local_1040);
    std::allocator<char>::~allocator(&local_1041);
    std::__cxx11::string::~string((string *)&local_ff8);
    std::allocator<char>::~allocator(&local_ff9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1068,"inline void {{ENUM_NAME}}Union::Reset() {",&local_1069);
    CodeWriter::operator+=(&this->code_,&local_1068);
    std::__cxx11::string::~string((string *)&local_1068);
    std::allocator<char>::~allocator(&local_1069);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1090,"  switch (type) {",
               (allocator<char> *)((long)&it_3._M_current + 7));
    CodeWriter::operator+=(&this->code_,&local_1090);
    std::__cxx11::string::~string((string *)&local_1090);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it_3._M_current + 7));
    pvVar3 = EnumDef::Vals(local_18);
    local_10a0._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3)
    ;
    while( true ) {
      pvVar3 = EnumDef::Vals(local_18);
      ev_4 = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar3);
      bVar2 = __gnu_cxx::operator!=
                        (&local_10a0,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev_4);
      if (!bVar2) break;
      ppEVar5 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_10a0);
      local_10b0 = *ppEVar5;
      bVar2 = EnumVal::IsZero(local_10b0);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10d0,"LABEL",&local_10d1);
        GetEnumValUse_abi_cxx11_(&local_10f8,this,local_18,local_10b0);
        CodeWriter::SetValue(&this->code_,&local_10d0,&local_10f8);
        std::__cxx11::string::~string((string *)&local_10f8);
        std::__cxx11::string::~string((string *)&local_10d0);
        std::allocator<char>::~allocator(&local_10d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1118,"TYPE",&local_1119)
        ;
        GetUnionElement_abi_cxx11_(&local_1140,this,local_10b0,true,&(this->opts_).super_IDLOptions)
        ;
        CodeWriter::SetValue(&this->code_,&local_1118,&local_1140);
        std::__cxx11::string::~string((string *)&local_1140);
        std::__cxx11::string::~string((string *)&local_1118);
        std::allocator<char>::~allocator(&local_1119);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1160,"    case {{LABEL}}: {",&local_1161);
        CodeWriter::operator+=(&this->code_,&local_1160);
        std::__cxx11::string::~string((string *)&local_1160);
        std::allocator<char>::~allocator(&local_1161);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1188,"      auto ptr = reinterpret_cast<{{TYPE}} *>(value);",
                   &local_1189);
        CodeWriter::operator+=(&this->code_,&local_1188);
        std::__cxx11::string::~string((string *)&local_1188);
        std::allocator<char>::~allocator(&local_1189);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11b0,"      delete ptr;",&local_11b1);
        CodeWriter::operator+=(&this->code_,&local_11b0);
        std::__cxx11::string::~string((string *)&local_11b0);
        std::allocator<char>::~allocator(&local_11b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11d8,"      break;",&local_11d9);
        CodeWriter::operator+=(&this->code_,&local_11d8);
        std::__cxx11::string::~string((string *)&local_11d8);
        std::allocator<char>::~allocator(&local_11d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1200,"    }",&local_1201);
        CodeWriter::operator+=(&this->code_,&local_1200);
        std::__cxx11::string::~string((string *)&local_1200);
        std::allocator<char>::~allocator(&local_1201);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_10a0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1228,"    default: break;",&local_1229);
    CodeWriter::operator+=(&this->code_,&local_1228);
    std::__cxx11::string::~string((string *)&local_1228);
    std::allocator<char>::~allocator(&local_1229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1250,"  }",&local_1251);
    CodeWriter::operator+=(&this->code_,&local_1250);
    std::__cxx11::string::~string((string *)&local_1250);
    std::allocator<char>::~allocator(&local_1251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1278,"  value = nullptr;",&local_1279);
    CodeWriter::operator+=(&this->code_,&local_1278);
    std::__cxx11::string::~string((string *)&local_1278);
    std::allocator<char>::~allocator(&local_1279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12a0,"  type = {{NONE}};",&local_12a1);
    CodeWriter::operator+=(&this->code_,&local_12a0);
    std::__cxx11::string::~string((string *)&local_12a0);
    std::allocator<char>::~allocator(&local_12a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_12c8,"}",&local_12c9);
    CodeWriter::operator+=(&this->code_,&local_12c8);
    std::__cxx11::string::~string((string *)&local_12c8);
    std::allocator<char>::~allocator(&local_12c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_12f0,"",&local_12f1);
    CodeWriter::operator+=(&this->code_,&local_12f0);
    std::__cxx11::string::~string((string *)&local_12f0);
    std::allocator<char>::~allocator(&local_12f1);
  }
  return;
}

Assistant:

void GenUnionPost(const EnumDef &enum_def) {
    // Generate a verifier function for this union that can be called by the
    // table verifier functions. It uses a switch case to select a specific
    // verifier function to call, this should be safe even if the union type
    // has been corrupted, since the verifiers will simply fail when called
    // on the wrong type.
    code_.SetValue("ENUM_NAME", Name(enum_def));

    code_ += "inline " + UnionVerifySignature(enum_def) + " {";
    code_ += "  switch (type) {";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));

      if (ev.IsNonZero()) {
        code_.SetValue("TYPE", GetUnionElement(ev, false, opts_));
        code_ += "    case {{LABEL}}: {";
        auto getptr =
            "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_.SetValue("ALIGN",
                           NumToString(ev.union_type.struct_def->minalign));
            code_ +=
                "      return verifier.VerifyField<{{TYPE}}>("
                "static_cast<const uint8_t *>(obj), 0, {{ALIGN}});";
          } else {
            code_ += getptr;
            code_ += "      return verifier.VerifyTable(ptr);";
          }
        } else if (IsString(ev.union_type)) {
          code_ += getptr;
          code_ += "      return verifier.VerifyString(ptr);";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      } else {
        code_ += "    case {{LABEL}}: {";
        code_ += "      return true;";  // "NONE" enum value.
        code_ += "    }";
      }
    }
    code_ += "    default: return true;";  // unknown values are OK.
    code_ += "  }";
    code_ += "}";
    code_ += "";

    code_ += "inline " + UnionVectorVerifySignature(enum_def) + " {";
    code_ += "  if (!values || !types) return !values && !types;";
    code_ += "  if (values->size() != types->size()) return false;";
    code_ +=
        "  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {";
    code_ += "    if (!Verify" + Name(enum_def) + "(";
    code_ += "        verifier,  values->Get(i), types->GetEnum<" +
             Name(enum_def) + ">(i))) {";
    code_ += "      return false;";
    code_ += "    }";
    code_ += "  }";
    code_ += "  return true;";
    code_ += "}";
    code_ += "";

    if (opts_.generate_object_based_api) {
      // Generate union Unpack() and Pack() functions.
      code_ += "inline " + UnionUnPackSignature(enum_def, false) + " {";
      code_ += "  (void)resolver;";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const auto &ev = **it;
        if (ev.IsZero()) { continue; }

        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, false, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_ += "      return new " +
                     WrapInNameSpace(*ev.union_type.struct_def) + "(*ptr);";
          } else {
            code_ += "      return ptr->UnPack(resolver);";
          }
        } else if (IsString(ev.union_type)) {
          code_ += "      return new std::string(ptr->c_str(), ptr->size());";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      }
      code_ += "    default: return nullptr;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      code_ += "inline " + UnionPackSignature(enum_def, false) + " {";
      code_ += "  (void)_rehasher;";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        auto &ev = **it;
        if (ev.IsZero()) { continue; }

        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<const {{TYPE}} *>(value);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_ += "      return _fbb.CreateStruct(*ptr).Union();";
          } else {
            code_.SetValue("NAME", ev.union_type.struct_def->name);
            code_ +=
                "      return Create{{NAME}}(_fbb, ptr, _rehasher).Union();";
          }
        } else if (IsString(ev.union_type)) {
          code_ += "      return _fbb.CreateString(*ptr).Union();";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      }
      code_ += "    default: return 0;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      // Union copy constructor
      code_ +=
          "inline {{ENUM_NAME}}Union::{{ENUM_NAME}}Union(const "
          "{{ENUM_NAME}}Union &u) : type(u.type), value(nullptr) {";
      code_ += "  switch (type) {";
      for (const auto &ev : enum_def.Vals()) {
        if (ev->IsZero()) { continue; }
        code_.SetValue("LABEL", GetEnumValUse(enum_def, *ev));
        code_.SetValue("TYPE", GetUnionElement(*ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        bool copyable = true;
        if (opts_.g_cpp_std < cpp::CPP_STD_11 &&
            ev->union_type.base_type == BASE_TYPE_STRUCT &&
            !ev->union_type.struct_def->fixed) {
          // Don't generate code to copy if table is not copyable.
          // TODO(wvo): make tables copyable instead.
          for (const auto &field : ev->union_type.struct_def->fields.vec) {
            if (!field->deprecated && field->value.type.struct_def &&
                !field->native_inline) {
              copyable = false;
              break;
            }
          }
        }
        if (copyable) {
          code_ +=
              "      value = new {{TYPE}}(*reinterpret_cast<{{TYPE}} *>"
              "(u.value));";
        } else {
          code_ +=
              "      FLATBUFFERS_ASSERT(false);  // {{TYPE}} not copyable.";
        }
        code_ += "      break;";
        code_ += "    }";
      }
      code_ += "    default:";
      code_ += "      break;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      // Union Reset() function.
      FLATBUFFERS_ASSERT(enum_def.Lookup("NONE"));
      code_.SetValue("NONE", GetEnumValUse(enum_def, *enum_def.Lookup("NONE")));

      code_ += "inline void {{ENUM_NAME}}Union::Reset() {";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const auto &ev = **it;
        if (ev.IsZero()) { continue; }
        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<{{TYPE}} *>(value);";
        code_ += "      delete ptr;";
        code_ += "      break;";
        code_ += "    }";
      }
      code_ += "    default: break;";
      code_ += "  }";
      code_ += "  value = nullptr;";
      code_ += "  type = {{NONE}};";
      code_ += "}";
      code_ += "";
    }
  }